

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

void emit_header(gif_dest_ptr dinfo,int num_colors,JSAMPARRAY colormap)

{
  int iVar1;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  int cshift;
  int FlagByte;
  int InitCodeSize;
  int ColorMapSize;
  int BitsPerPixel;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  int local_24;
  int local_1c;
  
  iVar1 = *(int *)(*(long *)(in_RDI + 0x38) + 0x128) + -8;
  if (0x100 < in_ESI) {
    *(undefined4 *)(**(long **)(in_RDI + 0x38) + 0x28) = 0x413;
    *(int *)(**(long **)(in_RDI + 0x38) + 0x2c) = in_ESI;
    (**(code **)**(undefined8 **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x38));
  }
  for (local_1c = 1; 1 << ((byte)local_1c & 0x1f) < in_ESI; local_1c = local_1c + 1) {
  }
  if (local_1c < 2) {
    local_24 = 2;
  }
  else {
    local_24 = local_1c;
  }
  putc(0x47,*(FILE **)(in_RDI + 0x20));
  putc(0x49,*(FILE **)(in_RDI + 0x20));
  putc(0x46,*(FILE **)(in_RDI + 0x20));
  putc(0x38,*(FILE **)(in_RDI + 0x20));
  putc(0x37,*(FILE **)(in_RDI + 0x20));
  putc(0x61,*(FILE **)(in_RDI + 0x20));
  put_word((gif_dest_ptr)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  put_word((gif_dest_ptr)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  putc(local_1c - 1U | (local_1c + -1) * 0x10 | 0x80U,*(FILE **)(in_RDI + 0x20));
  putc(0,*(FILE **)(in_RDI + 0x20));
  putc(0,*(FILE **)(in_RDI + 0x20));
  for (iVar2 = 0; iVar2 < 1 << ((byte)local_1c & 0x1f); iVar2 = iVar2 + 1) {
    if (iVar2 < in_ESI) {
      if (in_RDX == (long *)0x0) {
        in_stack_ffffffffffffffcc = iVar2 * 0xff;
        put_3bytes((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
      }
      else if (*(int *)(*(long *)(in_RDI + 0x38) + 0x40) == 2) {
        putc((int)(uint)*(byte *)(*in_RDX + (long)iVar2) >> ((byte)iVar1 & 0x1f),
             *(FILE **)(in_RDI + 0x20));
        putc((int)(uint)*(byte *)(in_RDX[1] + (long)iVar2) >> ((byte)iVar1 & 0x1f),
             *(FILE **)(in_RDI + 0x20));
        putc((int)(uint)*(byte *)(in_RDX[2] + (long)iVar2) >> ((byte)iVar1 & 0x1f),
             *(FILE **)(in_RDI + 0x20));
      }
      else {
        put_3bytes((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
      }
    }
    else {
      put_3bytes((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
    }
  }
  putc(0x2c,*(FILE **)(in_RDI + 0x20));
  put_word((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
  put_word((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
  put_word((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
  put_word((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
  putc(0,*(FILE **)(in_RDI + 0x20));
  putc(local_24,*(FILE **)(in_RDI + 0x20));
  compress_init((gif_dest_ptr)CONCAT44(iVar1,iVar2),in_stack_ffffffffffffffcc);
  return;
}

Assistant:

LOCAL(void)
emit_header(gif_dest_ptr dinfo, int num_colors, JSAMPARRAY colormap)
/* Output the GIF file header, including color map */
/* If colormap == NULL, synthesize a grayscale colormap */
{
  int BitsPerPixel, ColorMapSize, InitCodeSize, FlagByte;
  int cshift = dinfo->cinfo->data_precision - 8;
  int i;

  if (num_colors > 256)
    ERREXIT1(dinfo->cinfo, JERR_TOO_MANY_COLORS, num_colors);
  /* Compute bits/pixel and related values */
  BitsPerPixel = 1;
  while (num_colors > (1 << BitsPerPixel))
    BitsPerPixel++;
  ColorMapSize = 1 << BitsPerPixel;
  if (BitsPerPixel <= 1)
    InitCodeSize = 2;
  else
    InitCodeSize = BitsPerPixel;
  /*
   * Write the GIF header.
   * Note that we generate a plain GIF87 header for maximum compatibility.
   */
  putc('G', dinfo->pub.output_file);
  putc('I', dinfo->pub.output_file);
  putc('F', dinfo->pub.output_file);
  putc('8', dinfo->pub.output_file);
  putc('7', dinfo->pub.output_file);
  putc('a', dinfo->pub.output_file);
  /* Write the Logical Screen Descriptor */
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_width);
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_height);
  FlagByte = 0x80;              /* Yes, there is a global color table */
  FlagByte |= (BitsPerPixel - 1) << 4; /* color resolution */
  FlagByte |= (BitsPerPixel - 1); /* size of global color table */
  putc(FlagByte, dinfo->pub.output_file);
  putc(0, dinfo->pub.output_file); /* Background color index */
  putc(0, dinfo->pub.output_file); /* Reserved (aspect ratio in GIF89) */
  /* Write the Global Color Map */
  /* If the color map is more than 8 bits precision, */
  /* we reduce it to 8 bits by shifting */
  for (i = 0; i < ColorMapSize; i++) {
    if (i < num_colors) {
      if (colormap != NULL) {
        if (dinfo->cinfo->out_color_space == JCS_RGB) {
          /* Normal case: RGB color map */
          putc(colormap[0][i] >> cshift, dinfo->pub.output_file);
          putc(colormap[1][i] >> cshift, dinfo->pub.output_file);
          putc(colormap[2][i] >> cshift, dinfo->pub.output_file);
        } else {
          /* Grayscale "color map": possible if quantizing grayscale image */
          put_3bytes(dinfo, colormap[0][i] >> cshift);
        }
      } else {
        /* Create a grayscale map of num_colors values, range 0..255 */
        put_3bytes(dinfo, (i * 255 + (num_colors - 1) / 2) / (num_colors - 1));
      }
    } else {
      /* fill out the map to a power of 2 */
      put_3bytes(dinfo, CENTERJSAMPLE >> cshift);
    }
  }
  /* Write image separator and Image Descriptor */
  putc(',', dinfo->pub.output_file); /* separator */
  put_word(dinfo, 0);           /* left/top offset */
  put_word(dinfo, 0);
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_width); /* image size */
  put_word(dinfo, (unsigned int)dinfo->cinfo->output_height);
  /* flag byte: not interlaced, no local color map */
  putc(0x00, dinfo->pub.output_file);
  /* Write Initial Code Size byte */
  putc(InitCodeSize, dinfo->pub.output_file);

  /* Initialize for compression of image data */
  compress_init(dinfo, InitCodeSize + 1);
}